

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver_manager.cpp
# Opt level: O2

AdbcStatusCode AdbcConnectionRelease(AdbcConnection *connection,AdbcError *error)

{
  TempConnection *this;
  AdbcStatusCode AVar1;
  TempConnection *args;
  
  if (connection->private_driver == (AdbcDriver *)0x0) {
    this = (TempConnection *)connection->private_data;
    if (this == (TempConnection *)0x0) {
      return '\x06';
    }
    TempConnection::~TempConnection(this);
    operator_delete(this);
    AVar1 = '\0';
  }
  else {
    AVar1 = (*connection->private_driver->ConnectionRelease)(connection,error);
    connection = (AdbcConnection *)&connection->private_driver;
  }
  connection->private_data = (void *)0x0;
  return AVar1;
}

Assistant:

AdbcStatusCode AdbcConnectionRelease(struct AdbcConnection *connection, struct AdbcError *error) {
	if (!connection->private_driver) {
		if (connection->private_data) {
			TempConnection *args = reinterpret_cast<TempConnection *>(connection->private_data);
			delete args;
			connection->private_data = nullptr;
			return ADBC_STATUS_OK;
		}
		return ADBC_STATUS_INVALID_STATE;
	}
	INIT_ERROR(error, connection);
	auto status = connection->private_driver->ConnectionRelease(connection, error);
	connection->private_driver = nullptr;
	return status;
}